

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int unixCurrentTime(sqlite3_vfs *NotUsed,double *prNow)

{
  int iVar1;
  long lStack_20;
  int rc;
  sqlite3_int64 i;
  double *prNow_local;
  sqlite3_vfs *NotUsed_local;
  
  lStack_20 = 0;
  i = (sqlite3_int64)prNow;
  prNow_local = (double *)NotUsed;
  iVar1 = unixCurrentTimeInt64((sqlite3_vfs *)0x0,&stack0xffffffffffffffe0);
  *(double *)i = (double)lStack_20 / 86400000.0;
  return iVar1;
}

Assistant:

static int unixCurrentTime(sqlite3_vfs *NotUsed, double *prNow){
  sqlite3_int64 i = 0;
  int rc;
  UNUSED_PARAMETER(NotUsed);
  rc = unixCurrentTimeInt64(0, &i);
  *prNow = i/86400000.0;
  return rc;
}